

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* pbrt::MatchingFilenames
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *filenameBase)

{
  int iVar1;
  DIR *__dirp;
  dirent *pdVar2;
  bool bVar3;
  string dirStr;
  path basePath;
  undefined1 local_138 [40];
  pointer local_110;
  string local_108;
  string local_e8;
  path local_c8;
  path local_a0;
  string local_78;
  path local_58;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  filesystem::path::path(&local_a0,filenameBase);
  filesystem::path::parent_path((path *)local_138,&local_a0);
  filesystem::path::str_abi_cxx11_(&local_108,(path *)local_138,native_path);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_138 + 8));
  if (local_108._M_string_length == 0) {
    std::__cxx11::string::_M_replace((ulong)&local_108,0,(char *)0x0,0x460070);
  }
  __dirp = opendir(local_108._M_dataplus._M_p);
  if (__dirp == (DIR *)0x0) {
    filesystem::path::parent_path((path *)local_138,&local_a0);
    filesystem::path::str_abi_cxx11_((string *)&local_c8,(path *)local_138,native_path);
    local_58.m_type = local_c8.m_type;
    local_58._4_4_ = local_c8._4_4_;
    ErrorExit<char_const*>("%s: unable to open directory\n",(char **)&local_58);
  }
  filesystem::path::filename_abi_cxx11_((string *)local_138,&local_a0);
  local_110 = (pointer)local_138._8_8_;
  if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
    operator_delete((void *)local_138._0_8_,(ulong)(local_138._16_8_ + 1));
  }
  while (pdVar2 = readdir(__dirp), pdVar2 != (dirent *)0x0) {
    if (pdVar2->d_type == '\b') {
      filesystem::path::filename_abi_cxx11_(&local_78,&local_a0);
      iVar1 = strncmp(local_78._M_dataplus._M_p,pdVar2->d_name,(size_t)local_110);
      bVar3 = iVar1 == 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      bVar3 = false;
    }
    if (bVar3) {
      filesystem::path::parent_path(&local_c8,&local_a0);
      filesystem::path::path(&local_58,pdVar2->d_name);
      filesystem::path::operator/((path *)local_138,&local_c8,&local_58);
      filesystem::path::str_abi_cxx11_(&local_e8,(path *)local_138,native_path);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_138 + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_58.m_path);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_c8.m_path);
    }
  }
  closedir(__dirp);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a0.m_path);
  return __return_storage_ptr__;
}

Assistant:

std::string ReadFileContents(const std::string &filename) {
    std::ifstream ifs(filename, std::ios::binary);
    if (!ifs)
        ErrorExit("%s: %s", filename, ErrorString());
    return std::string((std::istreambuf_iterator<char>(ifs)),
                       (std::istreambuf_iterator<char>()));
}